

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

string * __thiscall
RenX_ServerListPlugin::server_as_long_json_abi_cxx11_
          (string *__return_storage_ptr__,RenX_ServerListPlugin *this,Server *server)

{
  size_type sVar1;
  char *pcVar2;
  size_type sVar3;
  char *pcVar4;
  undefined4 uVar5;
  bool bVar6;
  size_type sVar7;
  char **this_00;
  reference pbVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  reference ppPVar11;
  string_view sVar12;
  size_type local_708;
  char *local_700;
  undefined8 local_6f8;
  size_type local_6f0;
  size_type local_6e8;
  char *local_6e0;
  size_type local_6d8;
  char *local_6d0;
  undefined4 local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined4 local_6a0;
  undefined4 local_698;
  char *local_690;
  undefined4 local_688;
  char *local_680;
  undefined4 local_678;
  uint local_670;
  size_type local_668;
  const_pointer local_660;
  size_type local_650;
  size_type local_648;
  basic_string_view<char,_std::char_traits<char>_> *local_640;
  size_type local_638;
  uint local_62c;
  undefined1 *local_628;
  undefined4 local_61c;
  undefined8 local_618;
  char *local_610;
  byte local_605;
  undefined4 local_604;
  char *local_600;
  int local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  char *local_5e8;
  byte local_5d9;
  char *local_5d8;
  byte local_5c9;
  char *local_5c8;
  byte local_5b9;
  char *local_5b8;
  byte local_5a9;
  size_type local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  size_type local_598;
  char *local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_588;
  size_type local_580;
  char *local_578;
  undefined4 local_56c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_568;
  size_type local_560;
  char *local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  size_type local_548;
  char *local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_538;
  size_type local_530;
  char *local_528;
  undefined8 local_520;
  allocator<char> *local_518;
  char *local_510;
  char *local_508;
  long local_500;
  string *local_4f8;
  string *local_4f0;
  char *local_4e8;
  size_t local_4e0;
  basic_string_view<char,_std::char_traits<char>_> local_4d8;
  basic_string_view<char,_std::char_traits<char>_> local_4c8;
  basic_string_view<char,_std::char_traits<char>_> local_4b8;
  __sv_type local_4a8;
  string local_498;
  basic_string_view<char,_std::char_traits<char>_> local_478;
  __normal_iterator<const_RenX::PlayerInfo_**,_std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>_>
  local_468;
  basic_string_view<char,_std::char_traits<char>_> local_460;
  __sv_type local_450;
  string local_440;
  basic_string_view<char,_std::char_traits<char>_> local_420;
  __normal_iterator<const_RenX::PlayerInfo_**,_std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>_>
  local_410;
  iterator node;
  basic_string_view<char,_std::char_traits<char>_> local_3f8;
  basic_string_view<char,_std::char_traits<char>_> local_3e8;
  __sv_type local_3d8;
  string local_3c8;
  basic_string_view<char,_std::char_traits<char>_> local_3a8;
  size_type local_398;
  size_t index_1;
  __sv_type local_380;
  string local_370;
  basic_string_view<char,_std::char_traits<char>_> local_350;
  basic_string_view<char,_std::char_traits<char>_> local_340;
  basic_string_view<char,_std::char_traits<char>_> local_330;
  basic_string_view<char,_std::char_traits<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string_view<char,_std::char_traits<char>_> local_2f0;
  __sv_type local_2e0;
  string local_2d0;
  basic_string_view<char,_std::char_traits<char>_> local_2b0;
  size_type local_2a0;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  __sv_type local_258;
  string local_248;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  undefined1 local_208 [8];
  string server_json_block;
  string_view attribute;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  char *comma;
  undefined1 local_1b0 [8];
  string server_attributes;
  vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> activePlayers;
  undefined1 local_160 [8];
  string server_prefix;
  undefined1 auStack_138 [6];
  unsigned_short server_port;
  string_view server_hostname;
  undefined1 local_118 [8];
  string server_version;
  undefined1 local_e8 [8];
  string server_map;
  undefined1 local_a8 [8];
  string server_name;
  ListServerInfo serverInfo;
  Server *server_local;
  RenX_ServerListPlugin *this_local;
  
  local_4f8 = __return_storage_ptr__;
  local_4f0 = __return_storage_ptr__;
  serverInfo.attributes.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)server;
  getListServerInfo((ListServerInfo *)((long)&server_name.field_2 + 8),this,server);
  sVar12 = (string_view)RenX::Server::getName();
  local_4e8 = sVar12._M_str;
  local_4e0 = sVar12._M_len;
  jsonify_abi_cxx11_((string *)local_a8,sVar12);
  local_500 = RenX::Server::getMap();
  join_0x00000010_0x00000000_ =
       std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_500 + 0x10));
  jsonify_abi_cxx11_((string *)local_e8,join_0x00000010_0x00000000_);
  sVar12 = (string_view)RenX::Server::getGameVersion();
  local_510 = sVar12._M_str;
  local_508 = (char *)sVar12._M_len;
  server_hostname._M_str = local_508;
  jsonify_abi_cxx11_((string *)local_118,sVar12);
  _auStack_138 = server_name.field_2._8_8_;
  server_hostname._M_len = serverInfo.hostname._M_len;
  server_prefix.field_2._14_2_ = serverInfo.hostname._M_str._0_2_;
  sVar12._M_str = (char *)serverInfo.namePrefix._M_len;
  sVar12._M_len = serverInfo._16_8_;
  jsonify_abi_cxx11_((string *)local_160,sVar12);
  RenX::Server::activePlayers((bool)((char)&server_attributes + '\x18'));
  local_518 = (allocator<char> *)((long)&comma + 7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"[]",local_518);
  std::allocator<char>::~allocator((allocator<char> *)((long)&comma + 7));
  bVar6 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&serverInfo.namePrefix._M_str);
  if (!bVar6) {
    sVar7 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&serverInfo.namePrefix._M_str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
               sVar7 * 0x10 + 0x10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,"[");
    __range2 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)0x1313d8;
    this_00 = &serverInfo.namePrefix._M_str;
    __end2 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this_00);
    attribute._M_str =
         (char *)std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)this_00);
    while( true ) {
      bVar6 = __gnu_cxx::
              operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        (&__end2,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  *)&attribute._M_str);
      if (((bVar6 ^ 0xffU) & 1) == 0) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator*(&__end2);
      server_json_block.field_2._8_8_ = pbVar8->_M_len;
      attribute._M_len = (size_t)pbVar8->_M_str;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 (char *)__range2);
      __range2 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)anon_var_dwarf_27c;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 "\t\t\t\"");
      std::__cxx11::string::operator+=
                ((string *)local_1b0,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&server_json_block.field_2 + 8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,"\""
                );
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
               "\n\t\t],");
  }
  local_568 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  local_560 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_568);
  local_558 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        (local_568);
  local_550 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  local_548 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_550);
  local_540 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        (local_550);
  local_538 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  local_530 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_538);
  local_528 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        (local_538);
  local_520 = RenX::Server::getBotCount();
  local_5a8 = std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::size
                        ((vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>
                          *)(server_attributes.field_2._M_local_buf + 8));
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  local_598 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_5a0);
  local_590 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        (local_5a0);
  local_588 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
  local_580 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_588);
  local_578 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        (local_588);
  local_56c = RenX::Server::getMineLimit();
  local_5a9 = RenX::Server::isSteamRequired();
  local_5b8 = json_bool_as_cstring((bool)(local_5a9 & 1));
  local_5b9 = RenX::Server::isPrivateMessageTeamOnly();
  local_5c8 = json_bool_as_cstring((bool)(local_5b9 & 1));
  local_5c9 = RenX::Server::isPassworded();
  local_5d8 = json_bool_as_cstring((bool)(local_5c9 & 1));
  local_5d9 = RenX::Server::isPrivateMessagingEnabled();
  local_5e8 = json_bool_as_cstring((bool)(local_5d9 & 1));
  local_5ec = RenX::Server::getPlayerLimit();
  local_5f0 = RenX::Server::getVehicleLimit();
  local_5f4 = RenX::Server::getTeamMode();
  local_600 = json_bool_as_cstring(local_5f4 == 3);
  local_604 = RenX::Server::getTeamMode();
  local_605 = RenX::Server::isCratesEnabled();
  local_610 = json_bool_as_cstring((bool)(local_605 & 1));
  local_618 = RenX::Server::getCrateRespawnDelay();
  local_61c = RenX::Server::getTimeLimit();
  uVar5 = local_56c;
  pcVar4 = local_578;
  sVar3 = local_580;
  pcVar2 = local_590;
  sVar1 = local_598;
  local_62c = (uint)(ushort)server_prefix.field_2._14_2_;
  local_640 = (basic_string_view<char,_std::char_traits<char>_> *)auStack_138;
  local_638 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_640);
  local_660 = std::basic_string_view<char,_std::char_traits<char>_>::data(local_640);
  local_668 = local_638;
  local_670 = local_62c;
  local_678 = local_61c;
  local_680 = local_610;
  local_688 = local_604;
  local_690 = local_600;
  local_698 = local_5f0;
  local_6a0 = local_5ec;
  local_6a8 = local_5e8;
  local_6b0 = local_5d8;
  local_6b8 = local_5c8;
  local_6c0 = local_5b8;
  local_6c8 = uVar5;
  local_6d0 = pcVar4;
  local_6d8 = sVar3;
  local_6e0 = pcVar2;
  local_6e8 = sVar1;
  local_6f0 = local_5a8;
  local_6f8 = local_520;
  local_700 = local_528;
  local_708 = local_530;
  local_628 = (undefined1 *)&local_708;
  string_printf_abi_cxx11_
            ((string *)local_208,
             "{\n\t\t\"Name\": \"%.*s\",\n\t\t\"NamePrefix\": \"%.*s\",\n\t\t\"Current Map\": \"%.*s\",\n\t\t\"Bots\": %u,\n\t\t\"Players\": %u,\n\t\t\"Game Version\": \"%.*s\",\n\t\t\"Attributes\": %.*s,\n\t\t\"Variables\": {\n\t\t\t\"Mine Limit\": %d,\n\t\t\t\"bSteamRequired\": %s,\n\t\t\t\"bPrivateMessageTeamOnly\": %s,\n\t\t\t\"bPassworded\": %s,\n\t\t\t\"bAllowPrivateMessaging\": %s,\n\t\t\t\"Player Limit\": %d,\n\t\t\t\"Vehicle Limit\": %d,\n\t\t\t\"bAutoBalanceTeams\": %s,\n\t\t\t\"Team Mode\": %d,\n\t\t\t\"bSpawnCrates\": %s,\n\t\t\t\"CrateRespawnAfterPickup\": %f,\n\t\t\t\"Time Limit\": %d\n\t\t},\n\t\t\"Port\": %u,\n\t\t\"IP\": \"%.*s\""
             ,(int)local_618,local_560,local_558,local_548,local_540);
  sVar7 = std::vector<RenX::Map,_std::allocator<RenX::Map>_>::size
                    ((vector<RenX::Map,_std::allocator<RenX::Map>_> *)
                     &serverInfo.attributes.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_str);
  if (sVar7 != 0) {
    local_218 = sv(",\n\t\t\"Levels\": [",0xf);
    std::__cxx11::string::operator+=((string *)local_208,&local_218);
    local_228 = sv("\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x13);
    std::__cxx11::string::operator+=((string *)local_208,&local_228);
    pvVar9 = std::vector<RenX::Map,_std::allocator<RenX::Map>_>::operator[]
                       ((vector<RenX::Map,_std::allocator<RenX::Map>_> *)
                        &serverInfo.attributes.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_str,0);
    local_258 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(pvVar9 + 0x10));
    jsonify_abi_cxx11_(&local_248,local_258);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
               &local_248);
    std::__cxx11::string::~string((string *)&local_248);
    local_268 = sv("\",\n\t\t\t\t\"GUID\": \"",0x10);
    std::__cxx11::string::operator+=((string *)local_208,&local_268);
    std::vector<RenX::Map,_std::allocator<RenX::Map>_>::operator[]
              ((vector<RenX::Map,_std::allocator<RenX::Map>_> *)
               &serverInfo.attributes.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_str,0);
    RenX::formatGUID_abi_cxx11_((Map *)&local_288);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
               &local_288);
    std::__cxx11::string::~string((string *)&local_288);
    _index = sv("\"\n\t\t\t}",6);
    std::__cxx11::string::operator+=
              ((string *)local_208,(basic_string_view<char,_std::char_traits<char>_> *)&index);
    local_2a0 = 1;
    while( true ) {
      local_648 = local_2a0;
      sVar7 = std::vector<RenX::Map,_std::allocator<RenX::Map>_>::size
                        ((vector<RenX::Map,_std::allocator<RenX::Map>_> *)
                         &serverInfo.attributes.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_str);
      if (local_648 == sVar7) break;
      local_2b0 = sv(",\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x14);
      std::__cxx11::string::operator+=((string *)local_208,&local_2b0);
      pvVar9 = std::vector<RenX::Map,_std::allocator<RenX::Map>_>::operator[]
                         ((vector<RenX::Map,_std::allocator<RenX::Map>_> *)
                          &serverInfo.attributes.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_str,local_2a0);
      local_2e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(pvVar9 + 0x10));
      jsonify_abi_cxx11_(&local_2d0,local_2e0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 &local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      local_2f0 = sv("\",\n\t\t\t\t\"GUID\": \"",0x10);
      std::__cxx11::string::operator+=((string *)local_208,&local_2f0);
      std::vector<RenX::Map,_std::allocator<RenX::Map>_>::operator[]
                ((vector<RenX::Map,_std::allocator<RenX::Map>_> *)
                 &serverInfo.attributes.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_str,local_2a0);
      RenX::formatGUID_abi_cxx11_((Map *)&local_310);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 &local_310);
      std::__cxx11::string::~string((string *)&local_310);
      local_320 = sv("\"\n\t\t\t}",6);
      std::__cxx11::string::operator+=((string *)local_208,&local_320);
      local_2a0 = local_2a0 + 1;
    }
    local_330 = sv("\n\t\t]",4);
    std::__cxx11::string::operator+=((string *)local_208,&local_330);
  }
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(serverInfo.attributes.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  if (sVar7 != 0) {
    local_340 = sv(",\n\t\t\"Mutators\": [",0x11);
    std::__cxx11::string::operator+=((string *)local_208,&local_340);
    local_350 = sv("\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x13);
    std::__cxx11::string::operator+=((string *)local_208,&local_350);
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(serverInfo.attributes.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0);
    local_380 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar10);
    jsonify_abi_cxx11_(&local_370,local_380);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
               &local_370);
    std::__cxx11::string::~string((string *)&local_370);
    _index_1 = sv("\"\n\t\t\t}",6);
    std::__cxx11::string::operator+=
              ((string *)local_208,(basic_string_view<char,_std::char_traits<char>_> *)&index_1);
    local_398 = 1;
    while( true ) {
      local_650 = local_398;
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(serverInfo.attributes.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (local_650 == sVar7) break;
      local_3a8 = sv(",\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x14);
      std::__cxx11::string::operator+=((string *)local_208,&local_3a8);
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(serverInfo.attributes.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),local_398);
      local_3d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar10);
      jsonify_abi_cxx11_(&local_3c8,local_3d8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 &local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      local_3e8 = sv("\"\n\t\t\t}",6);
      std::__cxx11::string::operator+=((string *)local_208,&local_3e8);
      local_398 = local_398 + 1;
    }
    local_3f8 = sv("\n\t\t]",4);
    std::__cxx11::string::operator+=((string *)local_208,&local_3f8);
  }
  sVar7 = std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::size
                    ((vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> *)
                     (server_attributes.field_2._M_local_buf + 8));
  if (sVar7 != 0) {
    _node = sv(",\n\t\t\"PlayerList\": [",0x13);
    std::__cxx11::string::operator+=
              ((string *)local_208,(basic_string_view<char,_std::char_traits<char>_> *)&node);
    local_410._M_current =
         (PlayerInfo **)
         std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::begin
                   ((vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> *)
                    (server_attributes.field_2._M_local_buf + 8));
    local_420 = sv("\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x13);
    std::__cxx11::string::operator+=((string *)local_208,&local_420);
    ppPVar11 = __gnu_cxx::
               __normal_iterator<const_RenX::PlayerInfo_**,_std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>_>
               ::operator*(&local_410);
    local_450 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&(*ppPVar11)->name);
    jsonify_abi_cxx11_(&local_440,local_450);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
               &local_440);
    std::__cxx11::string::~string((string *)&local_440);
    local_460 = sv("\"\n\t\t\t}",6);
    std::__cxx11::string::operator+=((string *)local_208,&local_460);
    __gnu_cxx::
    __normal_iterator<const_RenX::PlayerInfo_**,_std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>_>
    ::operator++(&local_410);
    while( true ) {
      local_468._M_current =
           (PlayerInfo **)
           std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::end
                     ((vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> *
                      )(server_attributes.field_2._M_local_buf + 8));
      bVar6 = __gnu_cxx::
              operator==<const_RenX::PlayerInfo_**,_std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>_>
                        (&local_410,&local_468);
      if (((bVar6 ^ 0xffU) & 1) == 0) break;
      local_478 = sv(",\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x14);
      std::__cxx11::string::operator+=((string *)local_208,&local_478);
      ppPVar11 = __gnu_cxx::
                 __normal_iterator<const_RenX::PlayerInfo_**,_std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>_>
                 ::operator*(&local_410);
      local_4a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&(*ppPVar11)->name);
      jsonify_abi_cxx11_(&local_498,local_4a8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 &local_498);
      std::__cxx11::string::~string((string *)&local_498);
      local_4b8 = sv("\"\n\t\t\t}",6);
      std::__cxx11::string::operator+=((string *)local_208,&local_4b8);
      __gnu_cxx::
      __normal_iterator<const_RenX::PlayerInfo_**,_std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>_>
      ::operator++(&local_410);
    }
    local_4c8 = sv("\n\t\t]",4);
    std::__cxx11::string::operator+=((string *)local_208,&local_4c8);
  }
  local_4d8 = sv("\n\t}",3);
  std::__cxx11::string::operator+=((string *)local_208,&local_4d8);
  std::__cxx11::string::string
            ((string *)local_4f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_1b0);
  std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::~vector
            ((vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> *)
             (server_attributes.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_a8);
  ListServerInfo::~ListServerInfo((ListServerInfo *)((long)&server_name.field_2 + 8));
  return local_4f0;
}

Assistant:

std::string RenX_ServerListPlugin::server_as_long_json(const RenX::Server &server) {
	ListServerInfo serverInfo = getListServerInfo(server);

	std::string server_name = jsonify(server.getName());
	std::string server_map = jsonify(server.getMap().name);
	std::string server_version = jsonify(server.getGameVersion());
	std::string_view server_hostname = serverInfo.hostname;
	unsigned short server_port = serverInfo.port;
	std::string server_prefix = jsonify(serverInfo.namePrefix);
	std::vector<const RenX::PlayerInfo*> activePlayers = server.activePlayers(false);

	std::string server_attributes = "[]";
	if (!serverInfo.attributes.empty()) {
		server_attributes.reserve(16 * serverInfo.attributes.size() + 16);
		server_attributes = "[";

		const char* comma = "\n";
		for (std::string_view attribute : serverInfo.attributes) {
			server_attributes += comma;
			comma = ",\n";

			server_attributes += "\t\t\t\"";
			server_attributes += attribute;
			server_attributes += "\"";
		}

		server_attributes += "\n\t\t],";
	}

	std::string server_json_block = string_printf(R"json({
		"Name": "%.*s",
		"NamePrefix": "%.*s",
		"Current Map": "%.*s",
		"Bots": %u,
		"Players": %u,
		"Game Version": "%.*s",
		"Attributes": %.*s,
		"Variables": {
			"Mine Limit": %d,
			"bSteamRequired": %s,
			"bPrivateMessageTeamOnly": %s,
			"bPassworded": %s,
			"bAllowPrivateMessaging": %s,
			"Player Limit": %d,
			"Vehicle Limit": %d,
			"bAutoBalanceTeams": %s,
			"Team Mode": %d,
			"bSpawnCrates": %s,
			"CrateRespawnAfterPickup": %f,
			"Time Limit": %d
		},
		"Port": %u,
		"IP": "%.*s")json",
		server_name.size(), server_name.data(),
		server_prefix.size(), server_prefix.data(),
		server_map.size(), server_map.data(),
		server.getBotCount(),
		activePlayers.size(),
		server_version.size(), server_version.data(),
		server_attributes.size(), server_attributes.data(),

		server.getMineLimit(),
		json_bool_as_cstring(server.isSteamRequired()),
		json_bool_as_cstring(server.isPrivateMessageTeamOnly()),
		json_bool_as_cstring(server.isPassworded()),
		json_bool_as_cstring(server.isPrivateMessagingEnabled()),
		server.getPlayerLimit(),
		server.getVehicleLimit(),
		json_bool_as_cstring(server.getTeamMode() == 3),
		server.getTeamMode(),
		json_bool_as_cstring(server.isCratesEnabled()),
		server.getCrateRespawnDelay(),
		server.getTimeLimit(),

		server_port,
		server_hostname.size(), server_hostname.data());

	// Level Rotation
	if (server.maps.size() != 0) {
		server_json_block += ",\n\t\t\"Levels\": ["sv;

		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify(server.maps[0].name);
		server_json_block += "\",\n\t\t\t\t\"GUID\": \""sv;
		server_json_block += RenX::formatGUID(server.maps[0]);
		server_json_block += "\"\n\t\t\t}"sv;

		for (size_t index = 1; index != server.maps.size(); ++index) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify(server.maps[index].name);
			server_json_block += "\",\n\t\t\t\t\"GUID\": \""sv;
			server_json_block += RenX::formatGUID(server.maps[index]);
			server_json_block += "\"\n\t\t\t}"sv;
		}

		server_json_block += "\n\t\t]"sv;
	}

	// Mutators
	if (server.mutators.size() != 0) {
		server_json_block += ",\n\t\t\"Mutators\": ["sv;

		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify(server.mutators[0]);
		server_json_block += "\"\n\t\t\t}"sv;

		for (size_t index = 1; index != server.mutators.size(); ++index) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify(server.mutators[index]);
			server_json_block += "\"\n\t\t\t}"sv;
		}

		server_json_block += "\n\t\t]"sv;
	}

	// Player List
	if (activePlayers.size() != 0) {
		server_json_block += ",\n\t\t\"PlayerList\": ["sv;

		auto node = activePlayers.begin();

		// Add first player to JSON
		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify((*node)->name);
		server_json_block += "\"\n\t\t\t}"sv;
		++node;

		// Add remaining players to JSON
		while (node != activePlayers.end()) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify((*node)->name);
			server_json_block += "\"\n\t\t\t}"sv;
			++node;
		}

		server_json_block += "\n\t\t]"sv;
	}

	server_json_block += "\n\t}"sv;

	return static_cast<std::string>(server_json_block);
}